

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyByteFind2(char *zStr,sxu32 nLen,sxi32 c,sxu32 *pPos)

{
  int iVar1;
  char *pcVar2;
  char *local_38;
  char *zEnd;
  char *zIn;
  sxu32 *pPos_local;
  sxi32 c_local;
  sxu32 nLen_local;
  char *zStr_local;
  
  local_38 = zStr + (nLen - 1);
  while( true ) {
    if (local_38 < zStr) {
      return -6;
    }
    iVar1 = (int)zStr;
    if (*local_38 == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)local_38 - iVar1;
      }
      return 0;
    }
    pcVar2 = local_38 + -1;
    if (pcVar2 < zStr) {
      return -6;
    }
    if (*pcVar2 == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)pcVar2 - iVar1;
      }
      return 0;
    }
    pcVar2 = local_38 + -2;
    if (pcVar2 < zStr) {
      return -6;
    }
    if (*pcVar2 == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)pcVar2 - iVar1;
      }
      return 0;
    }
    pcVar2 = local_38 + -3;
    if (pcVar2 < zStr) {
      return -6;
    }
    if (*pcVar2 == c) break;
    local_38 = local_38 + -4;
  }
  if (pPos != (sxu32 *)0x0) {
    *pPos = (int)pcVar2 - iVar1;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyByteFind2(const char *zStr, sxu32 nLen, sxi32 c, sxu32 *pPos)
{
	const char *zIn = zStr;
	const char *zEnd;
	
	zEnd = &zIn[nLen - 1];
	for( ;; ){
		if( zEnd < zIn ){ break; } if( zEnd[0] == c ){ if( pPos ){ *pPos =  (sxu32)(zEnd - zIn);} return SXRET_OK; } zEnd--;
		if( zEnd < zIn ){ break; } if( zEnd[0] == c ){ if( pPos ){ *pPos =  (sxu32)(zEnd - zIn);} return SXRET_OK; } zEnd--;
		if( zEnd < zIn ){ break; } if( zEnd[0] == c ){ if( pPos ){ *pPos =  (sxu32)(zEnd - zIn);} return SXRET_OK; } zEnd--;
		if( zEnd < zIn ){ break; } if( zEnd[0] == c ){ if( pPos ){ *pPos =  (sxu32)(zEnd - zIn);} return SXRET_OK; } zEnd--;
	}
	return SXERR_NOTFOUND; 
}